

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O0

uint256 * __thiscall
anon_unknown.dwarf_d715c4::Scenario::NewTxHash
          (Scenario *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *orders)

{
  long lVar1;
  bool bVar2;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *psVar3;
  RandomMixin<FastRandomContext> *pRVar4;
  long in_RSI;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<uint256>,_bool> pVar5;
  uint64_t prio_cur;
  uint64_t prio_prev;
  size_t pos;
  vector<long,_std::allocator<long>_> *order;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range3;
  bool ok;
  const_iterator __end3;
  const_iterator __begin3;
  uint256 *in_stack_ffffffffffffff38;
  value_type *in_stack_ffffffffffffff40;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_ffffffffffffff48;
  uint256 *this_00;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffff68;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *local_88;
  byte local_69;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uint256::uint256(in_stack_ffffffffffffff38);
  do {
    RandomMixin<FastRandomContext>::rand256(in_stack_ffffffffffffff68);
    *(undefined8 *)(in_RDI->super_base_blob<256U>).m_data._M_elems = local_28;
    *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 8) = local_20;
    *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x10) = local_18;
    *(undefined8 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x18) = local_10;
    local_69 = 1;
    _GLOBAL__N_1::std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)in_stack_ffffffffffffff40);
    _GLOBAL__N_1::std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           *)in_stack_ffffffffffffff40);
    while (bVar2 = __gnu_cxx::
                   operator==<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                             ((__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                               *)in_stack_ffffffffffffff48,
                              (__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                               *)in_stack_ffffffffffffff40), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
      ::operator*((__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                   *)in_stack_ffffffffffffff38);
      local_88 = (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)0x1;
      while (in_stack_ffffffffffffff48 = local_88,
            psVar3 = (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                     std::vector<long,_std::allocator<long>_>::size
                               ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff38),
            in_stack_ffffffffffffff48 < psVar3) {
        in_stack_ffffffffffffff38 = *(uint256 **)(in_RSI + 8);
        std::vector<long,_std::allocator<long>_>::operator[]
                  ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff48,
                   (size_type)in_stack_ffffffffffffff40);
        pRVar4 = (RandomMixin<FastRandomContext> *)
                 TxRequestTracker::ComputePriority
                           ((TxRequestTracker *)this_00,in_RDI,(NodeId)in_stack_ffffffffffffff48,
                            SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
        in_stack_ffffffffffffff40 = *(value_type **)(in_RSI + 8);
        std::vector<long,_std::allocator<long>_>::operator[]
                  ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff48,
                   (size_type)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff68 =
             (RandomMixin<FastRandomContext> *)
             TxRequestTracker::ComputePriority
                       ((TxRequestTracker *)this_00,in_RDI,(NodeId)in_stack_ffffffffffffff48,
                        SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
        if (pRVar4 <= in_stack_ffffffffffffff68) {
          local_69 = 0;
          break;
        }
        local_88 = (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                   &(local_88->_M_t)._M_impl.field_0x1;
      }
      if (local_69 == 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
      ::operator++((__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                    *)in_stack_ffffffffffffff38);
    }
    if (local_69 != 0) {
      pVar5 = _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::insert
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_69 = pVar5.second & 1;
    }
    if (((local_69 ^ 0xff) & 1) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return this_00;
    }
  } while( true );
}

Assistant:

uint256 NewTxHash(const std::vector<std::vector<NodeId>>& orders = {})
    {
        uint256 ret;
        bool ok;
        do {
            ret = m_rng.rand256();
            ok = true;
            for (const auto& order : orders) {
                for (size_t pos = 1; pos < order.size(); ++pos) {
                    uint64_t prio_prev = m_runner.txrequest.ComputePriority(ret, order[pos - 1], true);
                    uint64_t prio_cur = m_runner.txrequest.ComputePriority(ret, order[pos], true);
                    if (prio_prev <= prio_cur) {
                        ok = false;
                        break;
                    }
                }
                if (!ok) break;
            }
            if (ok) {
                ok = m_runner.txhashset.insert(ret).second;
            }
        } while(!ok);
        return ret;
    }